

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O0

string * __thiscall pbrt::Interaction::ToString_abi_cxx11_(Interaction *this)

{
  long lVar1;
  bool bVar2;
  Vector3<float> *in_RSI;
  string *in_RDI;
  float *args_2;
  float *args_1;
  float *args;
  Vector3<float> *fmt;
  string local_68 [8];
  float *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  MediumInterface *in_stack_ffffffffffffffc8;
  
  args_2 = &in_RSI[3].super_Tuple3<pbrt::Vector3,_float>.y;
  args_1 = &in_RSI[4].super_Tuple3<pbrt::Vector3,_float>.y;
  args = &in_RSI[2].super_Tuple3<pbrt::Vector3,_float>.y;
  fmt = in_RSI + 2;
  bVar2 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 6));
  if (bVar2) {
    MediumHandle::ToString_abi_cxx11_((MediumHandle *)in_RDI);
    std::__cxx11::string::c_str();
  }
  lVar1._0_4_ = in_RSI[5].super_Tuple3<pbrt::Vector3,_float>.y;
  lVar1._4_4_ = in_RSI[5].super_Tuple3<pbrt::Vector3,_float>.z;
  if (lVar1 != 0) {
    MediumInterface::ToString_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::__cxx11::string::c_str();
  }
  StringPrintf<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*>
            ((char *)fmt,(Point3fi *)args,(Normal3<float> *)args_1,(Point2<float> *)args_2,in_RSI,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  if (lVar1 != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

std::string Interaction::ToString() const {
    return StringPrintf(
        "[ Interaction pi: %s n: %s uv: %s wo: %s time: %s "
        "medium: %s mediumInterface: %s ]",
        pi, n, uv, wo, time, medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)");
}